

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O2

int main(int argc,char **argv)

{
  __time_t _Var1;
  unsigned_long_long uVar2;
  undefined5 uVar3;
  undefined2 uVar4;
  undefined8 uVar5;
  uchar dlc_00;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  FILE *__stream;
  FILE *pFVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  undefined1 *puVar15;
  uint uVar16;
  char *__ptr;
  char *pcVar17;
  char cVar18;
  int iVar19;
  int *piVar20;
  FILE *outfile;
  long lVar21;
  bool bVar22;
  char rtr;
  uchar secbit;
  uchar vcid;
  uchar sdt;
  int interface;
  uint local_2260;
  int dlc;
  int n;
  int dlen_1;
  uchar brs;
  FILE *local_2248;
  char dir_1 [5];
  unsigned_long_long sec_1;
  uchar esi;
  char dir [5];
  int n_1;
  unsigned_long_long local_2218;
  int dlc_2;
  char tmp2 [10];
  char tmp1 [10];
  int data [8];
  char idstr [21];
  unsigned_long_long sec;
  int interface_2;
  unsigned_long_long usec;
  tm tms;
  char buf [6500];
  
  pFVar11 = _stdout;
  __stream = _stdin;
LAB_001012e0:
  do {
    while( true ) {
      local_2248 = pFVar11;
      uVar8 = getopt(argc,argv,"I:O:dv?");
      puVar15 = &main_disable_dir;
      if (uVar8 != 100) break;
LAB_001012fd:
      *puVar15 = 1;
      pFVar11 = local_2248;
    }
    if (uVar8 == 0x76) {
      puVar15 = &main_verbose;
      goto LAB_001012fd;
    }
    if (uVar8 != 0x4f) {
      if (uVar8 == 0x3f) {
        pcVar17 = __xpg_basename(*argv);
        print_usage(pcVar17);
        return 0;
      }
      if (uVar8 != 0x49) {
        if (uVar8 != 0xffffffff) {
          fprintf(_stderr,"Unknown option %c\n",(ulong)uVar8);
          pcVar17 = __xpg_basename(*argv);
          print_usage(pcVar17);
          return 1;
        }
        uVar5 = eval_canxl_xl_read_tv._0_8_;
        break;
      }
      __stream = fopen(_optarg,"r");
      pFVar11 = local_2248;
      if (__stream == (FILE *)0x0) {
        pcVar17 = "infile";
        goto LAB_00102181;
      }
      goto LAB_001012e0;
    }
    pFVar11 = fopen(_optarg,"w");
    if (pFVar11 == (FILE *)0x0) {
      pcVar17 = "outfile";
LAB_00102181:
      perror(pcVar17);
      return 1;
    }
  } while( true );
LAB_0010137d:
  do {
    do {
      do {
        do {
          eval_canxl_xl_read_tv._0_8_ = uVar5;
          pcVar17 = buf + 9;
LAB_00101387:
          do {
            pcVar12 = fgets(buf,0x1963,__stream);
            if (pcVar12 == (char *)0x0) {
              fclose(local_2248);
              fclose(__stream);
              return 0;
            }
            if (main::dplace == 0) {
              if ((main::base == '\0') &&
                 (iVar9 = __isoc99_sscanf(buf,"base %9s timestamps %9s",tmp1,tmp2), iVar9 == 2)) {
                main::base = tmp1[0];
                main::timestamps = tmp2[0];
                if (main_verbose == '\x01') {
                  printf("base %c timestamps %c\n",(ulong)(uint)(int)tmp1[0]);
                }
                if ((main::base == 'd') || (main::base == 'h')) {
                  if ((main::timestamps == 'a') || (main::timestamps == 'r')) goto LAB_00101387;
                  pcVar12 = "invalid timestamps %s (must be \'absolute\' or \'relative\')!\n";
                  pcVar17 = tmp2;
                }
                else {
                  pcVar12 = "invalid base %s (must be \'hex\' or \'dez\')!\n";
                  pcVar17 = tmp1;
                }
                printf(pcVar12,pcVar17);
                return 1;
              }
              if ((main::date_tv.tv_sec == 0) && (buf._0_4_ == 0x65746164)) {
                data[0] = 0;
                pcVar12 = strcasestr(pcVar17," am ");
                if ((pcVar12 == (char *)0x0) &&
                   (pcVar12 = strcasestr(pcVar17," pm "), pcVar12 == (char *)0x0)) {
                  pcVar12 = setlocale(2,"de_DE");
                  __ptr = "Setting locale to \'de_DE\' failed!\n";
                  if (pcVar12 == (char *)0x0) goto LAB_00101645;
                  pcVar12 = strptime(pcVar17,"%B %d %H:%M:%S %Y",(tm *)&tms);
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = "%B %d %H:%M:%S.%Y %Y";
LAB_001014fa:
                    pcVar12 = strptime(pcVar17,pcVar12,(tm *)&tms);
                    if (pcVar12 != (char *)0x0) {
                      __isoc99_sscanf(pcVar17,"%*s %*d %*d:%*d:%*d.%3u ",data);
                      goto LAB_0010152c;
                    }
                    goto LAB_0010165a;
                  }
LAB_0010152c:
                  main::date_tv.tv_sec = mktime((tm *)&tms);
                  main::date_tv.tv_usec = (__suseconds_t)(uint)(data[0] * 1000);
                  if (main::date_tv.tv_sec < 0) goto LAB_0010165a;
                }
                else {
                  pcVar12 = setlocale(2,"en_US");
                  __ptr = "Setting locale to \'en_US\' failed!\n";
                  if (pcVar12 != (char *)0x0) {
                    pcVar12 = strptime(pcVar17,"%B %d %I:%M:%S %p %Y",(tm *)&tms);
                    if (pcVar12 == (char *)0x0) {
                      pcVar12 = "%B %d %I:%M:%S.%Y %p %Y";
                      goto LAB_001014fa;
                    }
                    goto LAB_0010152c;
                  }
LAB_00101645:
                  fwrite(__ptr,0x22,1,_stderr);
LAB_0010165a:
                  fwrite("Not able to determine original log file date. Using current time.\n",0x42,
                         1,_stderr);
                  gettimeofday((timeval *)&main::date_tv,(__timezone_ptr_t)0x0);
                }
                _Var1 = main::date_tv.tv_sec;
                if (main_verbose == '\x01') {
                  pcVar12 = ctime(&main::date_tv.tv_sec);
                  printf("date %llu => %s",_Var1,pcVar12);
                }
              }
              else {
                iVar9 = __isoc99_sscanf(buf,"%llu.%9s %9s ",&sec,tmp2,tmp1);
                if (iVar9 == 3) {
                  sVar13 = strlen(tmp2);
                  main::dplace = (int)sVar13;
                  if (main_verbose == '\x01') {
                    printf("decimal place %d, e.g. \'%s\'\n",sVar13 & 0xffffffff,tmp2);
                  }
                  if (main::dplace - 7U < 0xfffffffd) {
                    printf("invalid dplace %d (must be 4, 5 or 6)!\n",(ulong)(uint)main::dplace);
                    return 1;
                  }
                  goto LAB_001013a9;
                }
              }
              goto LAB_00101387;
            }
LAB_001013a9:
            iVar9 = __isoc99_sscanf(buf,"%llu.%llu %9s ",&sec,&usec,tmp1);
          } while (iVar9 != 3);
          iVar10 = bcmp(tmp1,"CANXL",5);
          cVar18 = main::timestamps;
          iVar9 = main::dplace;
          if (iVar10 == 0) goto LAB_0010194d;
          iVar10 = bcmp(tmp1,"CANFD",5);
          cVar18 = main::base;
          iVar9 = main::dplace;
          bVar6 = main_disable_dir;
          local_2260 = (uint)main::timestamps;
          if (iVar10 == 0) {
            local_2218 = CONCAT44(local_2218._4_4_,main::dplace);
            tms.tm_zone = (char *)0x0;
            tms.tm_isdst = 0;
            tms._36_4_ = 0;
            tms.tm_gmtoff = 0;
            tms.tm_mon = 0;
            tms.tm_year = 0;
            tms.tm_wday = 0;
            tms.tm_yday = 0;
            _rtr = 0;
            tms.tm_sec = 0;
            tms.tm_min = 0;
            tms.tm_hour = 0;
            tms.tm_mday = 0;
            n = 0;
            pcVar17 = dir;
            iVar9 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %20s %hhx %hhx %x %d %n",idstr,&sec_1,
                                    pcVar17,dir_1,data,&brs,&esi,&dlc,&rtr,&n);
            if (iVar9 != 9) {
              pcVar17 = dir;
              iVar9 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %20s %*s %hhx %hhx %x %d %n",idstr,
                                      &sec_1,pcVar17,dir_1,data,&brs,&esi,&dlc,&rtr,&n);
              uVar5 = eval_canxl_xl_read_tv._0_8_;
              if (iVar9 != 9) goto LAB_0010137d;
            }
            uVar2 = sec_1;
            uVar8 = _rtr;
            eval_canfd_read_tv[0] = idstr[0];
            eval_canfd_read_tv[1] = idstr[1];
            eval_canfd_read_tv[2] = idstr[2];
            eval_canfd_read_tv[3] = idstr[3];
            eval_canfd_read_tv[4] = idstr[4];
            eval_canfd_read_tv[5] = idstr[5];
            eval_canfd_read_tv[6] = idstr[6];
            eval_canfd_read_tv[7] = idstr[7];
            eval_canfd_read_tv._8_8_ = sec_1;
            uVar5 = eval_canxl_xl_read_tv._0_8_;
            if (((((int)_rtr < 0x41) && (dlc < 0x10)) && (brs < 2)) &&
               ((esi < 2 &&
                (sVar13 = strlen(dir_1), uVar5 = eval_canxl_xl_read_tv._0_8_, sVar13 == 2)))) {
              if ((bVar6 & 1) != 0) {
                dir_1[0] = '.';
              }
              if (((int)local_2218 != 4 || (long)uVar2 < 0x147ae14) &&
                 ((int)local_2218 != 5 || (long)uVar2 < 0xccccccc)) {
                dlc_00 = can_fd_len2dlc((uchar)uVar8);
                bVar6 = can_fd_dlc2len(dlc_00);
                uVar5 = eval_canxl_xl_read_tv._0_8_;
                if (uVar8 == bVar6) {
                  get_can_id((canid_t *)&tms,(char *)data,0x10);
                  uVar8 = _rtr;
                  pcVar12 = buf + n;
                  tms.tm_min._0_1_ = (char)_rtr;
                  for (lVar21 = 0; iVar9 = (int)pcVar17, lVar21 < (int)_rtr; lVar21 = lVar21 + 1) {
                    bVar6 = asc2nibble(*pcVar12);
                    uVar5 = eval_canxl_xl_read_tv._0_8_;
                    if ((0xf < bVar6) ||
                       (bVar7 = asc2nibble(pcVar12[1]), uVar5 = eval_canxl_xl_read_tv._0_8_,
                       0xf < bVar7)) goto LAB_0010137d;
                    *(byte *)((long)&tms.tm_hour + lVar21) = bVar7 | bVar6 << 4;
                    pcVar12 = pcVar12 + 3;
                  }
                  iVar10 = __isoc99_sscanf(pcVar12,"   %*x %*x %x ",&interface);
                  uVar5 = eval_canxl_xl_read_tv._0_8_;
                  if (iVar10 == 1) {
                    if (((uint)interface >> 0xc & 1) == 0) {
                      if ((interface & 0x10U) != 0) {
                        uVar8 = 8;
                        if (dlc < 8) {
                          uVar8 = dlc;
                        }
                        tms._0_8_ = CONCAT35(tms.tm_min._1_3_,CONCAT14((char)uVar8,tms.tm_sec)) |
                                    0x40000000;
                      }
                      if (dlc - 9U < 7 && (char)uVar8 == '\b') {
                        tms.tm_min._3_1_ = (char)dlc;
                      }
                    }
                    else {
                      bVar22 = ((uint)interface >> 0xd & 1) == 0;
                      uVar4 = tms.tm_min._2_2_;
                      uVar3 = tms._0_5_;
                      tms._0_8_ = CONCAT26(tms.tm_min._2_2_,CONCAT15(bVar22,tms._0_5_)) ^
                                  0x50000000000;
                      if (((uint)interface >> 0xe & 1) != 0) {
                        tms._0_8_ = CONCAT26(uVar4,CONCAT15(bVar22,uVar3)) ^ 0x50000000000 |
                                    0x20000000000;
                      }
                    }
                    puVar15 = eval_canfd_tv;
                    calc_tv((timeval *)eval_canfd_tv,(timeval *)eval_canfd_read_tv,
                            (timeval *)(ulong)local_2260,(char)local_2218,iVar9);
                    iVar9 = dir._0_4_;
                    cVar18 = dir_1[0];
                    goto LAB_00101cb4;
                  }
                }
              }
            }
            goto LAB_0010137d;
          }
          tms.tm_zone = (char *)0x0;
          tms.tm_isdst = 0;
          tms._36_4_ = 0;
          tms.tm_gmtoff = 0;
          tms.tm_mon = 0;
          tms.tm_year = 0;
          tms.tm_wday = 0;
          tms.tm_yday = 0;
          tms.tm_sec = 0;
          tms.tm_min = 0;
          tms.tm_hour = 0;
          tms.tm_mday = 0;
          dlc = 0;
          piVar20 = &interface;
          iVar10 = __isoc99_sscanf(buf,"%llu.%llu %d %20s",&sec_1,dir_1,piVar20,idstr);
          iVar19 = (int)piVar20;
          if (iVar10 == 4) {
            eval_can_read_tv._0_8_ = sec_1;
            eval_can_read_tv._9_7_ = stack0xffffffffffffddc1;
            eval_can_read_tv[8] = dir_1[0];
            iVar10 = bcmp(idstr,"ErrorFrame",10);
            if (iVar10 == 0) {
              tms._0_5_ = 0x820000080;
              calc_tv((timeval *)eval_can_tv,(timeval *)eval_can_read_tv,
                      (timeval *)(ulong)local_2260,(char)iVar9,iVar19);
              puVar15 = eval_can_tv;
              iVar9 = interface;
              cVar18 = '.';
              goto LAB_00101cb4;
            }
          }
          pcVar17 = "%llu.%llu %d %20s %4s %c %x %d %d %d %d %d %d %d %d";
          if (cVar18 == 'h') {
            pcVar17 = "%llu.%llu %d %20s %4s %c %x %x %x %x %x %x %x %x %x";
          }
          piVar20 = &interface;
          iVar10 = __isoc99_sscanf(buf,pcVar17,&sec_1,dir_1,piVar20,idstr,dir,&rtr,&dlc,data,
                                   data + 1,data + 2,data + 3,data + 4,data + 5,data + 6,data + 7);
          iVar19 = (int)piVar20;
          eval_can_read_tv._0_8_ = sec_1;
          eval_can_read_tv._9_7_ = stack0xffffffffffffddc1;
          eval_can_read_tv[8] = dir_1[0];
          uVar5 = eval_canxl_xl_read_tv._0_8_;
        } while ((iVar10 < 7) || (0xf < dlc));
        uVar8 = dlc;
        if (7 < dlc) {
          uVar8 = 8;
        }
      } while ((iVar10 != uVar8 + 7) && ((iVar10 != 7 || (rtr != 'r'))));
      iVar10 = 10;
      if (cVar18 == 'h') {
        iVar10 = 0x10;
      }
      get_can_id((canid_t *)&tms,idstr,iVar10);
      if (8 < dlc) {
        tms.tm_min._3_1_ = (char)dlc;
      }
      sVar13 = strlen(dir);
      uVar5 = eval_canxl_xl_read_tv._0_8_;
    } while (sVar13 != 2);
    if ((bVar6 & 1) != 0) {
      dir[0] = '.';
    }
  } while ((iVar9 == 4 && 0x147ae13 < (long)eval_can_read_tv._8_8_) ||
          (iVar9 == 5 && 0xccccccb < (long)eval_can_read_tv._8_8_));
  tms.tm_min._0_1_ = (char)uVar8;
  if (rtr == 'r') {
    tms._0_8_ = CONCAT44(tms.tm_min,tms.tm_sec) | 0x40000000;
  }
  else {
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      *(char *)((long)&tms.tm_hour + uVar14) = (char)data[uVar14];
    }
  }
  puVar15 = eval_can_tv;
  calc_tv((timeval *)eval_can_tv,(timeval *)eval_can_read_tv,(timeval *)(ulong)local_2260,
          (char)iVar9,iVar19);
  iVar9 = interface;
  cVar18 = dir[0];
  goto LAB_00101cb4;
LAB_0010194d:
  uVar8 = (uint)main_disable_dir;
  outfile = (FILE *)&dlc;
  iVar10 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %4s ",dir_1,dir,&interface_2,outfile,&rtr);
  uVar5 = eval_canxl_xl_read_tv._0_8_;
  if (((iVar10 != 5) ||
      (sVar13 = strlen((char *)&dlc), uVar5 = eval_canxl_xl_read_tv._0_8_, sVar13 != 2)) ||
     (sVar13 = strlen(&rtr), uVar5 = eval_canxl_xl_read_tv._0_8_, sVar13 != 4)) goto LAB_0010137d;
  uVar16 = (uint)cVar18;
  cVar18 = (char)iVar9;
  if (_rtr != 0x46464c58) {
    if ((_rtr == 0x46464246) || (_rtr == 0x46464546)) {
      eval_canxl_fd(buf,(timeval *)(ulong)uVar16,cVar18,uVar8,(int)local_2248,outfile);
      uVar5 = eval_canxl_xl_read_tv._0_8_;
    }
    else if ((_rtr == 0x46464243) || (_rtr == 0x46464543)) {
      eval_canxl_cc(buf,(timeval *)(ulong)uVar16,cVar18,uVar8,(int)local_2248,outfile);
      uVar5 = eval_canxl_xl_read_tv._0_8_;
    }
    goto LAB_0010137d;
  }
  local_2260 = uVar16;
  memset(&tms,0,0x80c);
  dlen_1 = 0;
  n_1 = 0;
  piVar20 = &n;
  iVar10 = __isoc99_sscanf(buf,
                           "%llu.%llu %*s %d %4s %*s %*s %*s %20s %hhx %hhx %x %d %*s %*s %hhx %x %n"
                           ,idstr,&sec_1,piVar20,&interface,data,&sdt,&secbit,&dlc_2,&dlen_1,&vcid,
                           &brs,&n_1);
  if (iVar10 != 0xb) {
    piVar20 = &n;
    iVar10 = __isoc99_sscanf(buf,
                             "%llu.%llu %*s %d %4s %*s %*s %*s %20s %*s %hhx %hhx %x %d %*s %*s %hhx %x %n"
                             ,idstr,&sec_1,piVar20,&interface,data,&sdt,&secbit,&dlc_2,&dlen_1,&vcid
                             ,&brs,&n_1);
    uVar5 = eval_canxl_xl_read_tv._0_8_;
    if (iVar10 != 0xb) goto LAB_0010137d;
  }
  iVar19 = dlc_2;
  iVar10 = dlen_1;
  uVar5._0_1_ = idstr[0];
  uVar5._1_1_ = idstr[1];
  uVar5._2_1_ = idstr[2];
  uVar5._3_1_ = idstr[3];
  uVar5._4_1_ = idstr[4];
  uVar5._5_1_ = idstr[5];
  uVar5._6_1_ = idstr[6];
  uVar5._7_1_ = idstr[7];
  eval_canxl_xl_read_tv[0] = idstr[0];
  eval_canxl_xl_read_tv[1] = idstr[1];
  eval_canxl_xl_read_tv[2] = idstr[2];
  eval_canxl_xl_read_tv[3] = idstr[3];
  eval_canxl_xl_read_tv[4] = idstr[4];
  eval_canxl_xl_read_tv[5] = idstr[5];
  eval_canxl_xl_read_tv[6] = idstr[6];
  eval_canxl_xl_read_tv[7] = idstr[7];
  eval_canxl_xl_read_tv._8_8_ = sec_1;
  if (((0x800 < dlen_1) || (uVar5 = eval_canxl_xl_read_tv._0_8_, 0x7ff < dlc_2)) || (1 < secbit))
  goto LAB_0010137d;
  tms.tm_min._1_1_ = sdt;
  tms.tm_hour = _brs;
  local_2218 = sec_1;
  sVar13 = strlen((char *)&interface);
  uVar5 = eval_canxl_xl_read_tv._0_8_;
  if (sVar13 != 2) goto LAB_0010137d;
  if (uVar8 != 0) {
    interface = CONCAT31(interface._1_3_,0x2e);
  }
  if ((iVar9 == 4 && 0x147ae13 < (long)local_2218) ||
     (iVar10 != iVar19 + 1 || 0xccccccb < (long)local_2218 && iVar9 == 5)) goto LAB_0010137d;
  get_can_id((canid_t *)&tms,(char *)data,0x10);
  uVar5 = eval_canxl_xl_read_tv._0_8_;
  if (0x7ff < (uint)tms.tm_sec) goto LAB_0010137d;
  if (vcid != '\0') {
    tms.tm_sec = (uint)vcid << 0x10 | tms.tm_sec;
  }
  pcVar17 = buf + n_1;
  tms.tm_min._2_2_ = (short)dlen_1;
  for (lVar21 = 0; iVar9 = (int)piVar20, lVar21 < dlen_1; lVar21 = lVar21 + 1) {
    bVar6 = asc2nibble(*pcVar17);
    uVar5 = eval_canxl_xl_read_tv._0_8_;
    if ((0xf < bVar6) ||
       (bVar7 = asc2nibble(pcVar17[1]), uVar5 = eval_canxl_xl_read_tv._0_8_, 0xf < bVar7))
    goto LAB_0010137d;
    *(byte *)((long)&tms.tm_mday + lVar21) = bVar7 | bVar6 << 4;
    pcVar17 = pcVar17 + 3;
  }
  iVar10 = __isoc99_sscanf(pcVar17,"%*x %x ",&esi);
  uVar5 = eval_canxl_xl_read_tv._0_8_;
  if ((iVar10 != 1) || ((_esi >> 0x16 & 1) == 0)) goto LAB_0010137d;
  tms.tm_min._0_1_ = (byte)(_esi >> 0x16) & 2 | (_esi >> 0x18 & 1) == 0 ^ 0x81U;
  calc_tv((timeval *)eval_canxl_xl_tv,(timeval *)eval_canxl_xl_read_tv,(timeval *)(ulong)local_2260,
          cVar18,iVar9);
  puVar15 = eval_canxl_xl_tv;
  iVar9 = n;
  cVar18 = (char)interface;
LAB_00101cb4:
  pFVar11 = local_2248;
  prframe((FILE *)local_2248,(timeval *)puVar15,iVar9,(cu_t *)&tms,cVar18);
  fflush(pFVar11);
  uVar5 = eval_canxl_xl_read_tv._0_8_;
  goto LAB_0010137d;
}

Assistant:

int main(int argc, char **argv)
{
	char buf[BUFLEN], tmp1[10], tmp2[10];

	FILE *infile = stdin;
	FILE *outfile = stdout;
	static int verbose, disable_dir;
	static struct timeval date_tv; /* date of the ASC file */
	static int dplace; /* decimal place 4, 5 or 6 or uninitialized */
	static char base; /* 'd'ec or 'h'ex */
	static char timestamps; /* 'a'bsolute or 'r'elative */
	int opt;
	unsigned long long sec, usec;

	while ((opt = getopt(argc, argv, "I:O:dv?")) != -1) {
		switch (opt) {
		case 'I':
			infile = fopen(optarg, "r");
			if (!infile) {
				perror("infile");
				return 1;
			}
			break;

		case 'O':
			outfile = fopen(optarg, "w");
			if (!outfile) {
				perror("outfile");
				return 1;
			}
			break;

		case 'd':
			disable_dir = 1;
			break;

		case 'v':
			verbose = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			return 0;
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			return 1;
			break;
		}
	}


	while (fgets(buf, BUFLEN-1, infile)) {

		if (!dplace) { /* the representation of a valid CAN frame not known */

			/* check for base and timestamp entries in the header */
			if ((!base) &&
			    (sscanf(buf, "base %9s timestamps %9s", tmp1, tmp2) == 2)) {
				base = tmp1[0];
				timestamps = tmp2[0];
				if (verbose)
					printf("base %c timestamps %c\n", base, timestamps);
				if ((base != 'h') && (base != 'd')) {
					printf("invalid base %s (must be 'hex' or 'dez')!\n",
					       tmp1);
					return 1;
				}
				if ((timestamps != 'a') && (timestamps != 'r')) {
					printf("invalid timestamps %s (must be 'absolute'"
					       " or 'relative')!\n", tmp2);
					return 1;
				}
				continue;
			}

			/* check for the original logging date in the header */ 
			if ((!date_tv.tv_sec) &&
			    (!strncmp(buf, "date", 4))) {

				if (get_date(&date_tv, &buf[9])) { /* skip 'date day ' */
					fprintf(stderr, "Not able to determine original log "
						"file date. Using current time.\n");
					/* use current date as default */
					gettimeofday(&date_tv, NULL);
				}
				if (verbose)
					printf("date %llu => %s", (unsigned long long)date_tv.tv_sec, ctime(&date_tv.tv_sec));
				continue;
			}

			/* check for decimal places length in valid CAN frames */
			if (sscanf(buf, "%llu.%9s %9s ", &sec, tmp2,
				   tmp1) != 3)
				continue; /* dplace remains zero until first found CAN frame */

			dplace = strlen(tmp2);
			if (verbose)
				printf("decimal place %d, e.g. '%s'\n", dplace,
				       tmp2);
			if (dplace < 4 || dplace > 6) {
				printf("invalid dplace %d (must be 4, 5 or 6)!\n",
				       dplace);
				return 1;
			}
		}

		/*
		 * The representation of a valid CAN frame is known here.
		 * So try to get CAN frames and ErrorFrames and convert them.
		 */

		/* check classic CAN format or the CANFD/CANXL tag which can take different types */
		if (sscanf(buf, "%llu.%llu %9s ", &sec,  &usec, tmp1) == 3) {
			if (!strncmp(tmp1, "CANXL", 5))
				eval_canxl(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else if (!strncmp(tmp1, "CANFD", 5))
				eval_canfd(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else
				eval_can(buf, &date_tv, timestamps, base, dplace, disable_dir, outfile);
		}
	}
	fclose(outfile);
	fclose(infile);
	return 0;
}